

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_strategy ZVar3;
  ZSTD_literalCompressionMode_e ZVar4;
  HUF_repeat HVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  bool bVar8;
  seqStore_t *seqStorePtr;
  uint *puVar9;
  U32 *pUVar10;
  symbolEncodingType_e sVar11;
  int iVar12;
  size_t err_code;
  size_t sVar13;
  seqStore_t *psVar14;
  size_t sVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  size_t sVar19;
  FSE_CTable *pFVar20;
  ZSTD_fseCTables_t *pZVar21;
  long lVar22;
  size_t sVar23;
  bool bVar24;
  uint uVar25;
  size_t unaff_R12;
  size_t err_code_5;
  ulong uVar26;
  ulong uVar27;
  byte *pbVar28;
  byte *pbVar29;
  BYTE *istart;
  ulong uVar30;
  byte *pbVar31;
  uint max;
  byte local_1a9;
  BYTE *local_1a8;
  size_t local_1a0;
  ZSTD_compressedBlockState_t *local_198;
  seqStore_t *local_190;
  ZSTD_compressedBlockState_t *local_188;
  size_t local_180;
  uint *local_178;
  ZSTD_fseCTables_t *local_170;
  FSE_CTable *local_168;
  U32 *local_160;
  symbolEncodingType_e local_154;
  seqDef *local_150;
  ulong local_148;
  BYTE *local_140;
  ulong local_138;
  BYTE *local_130;
  BYTE *local_128;
  ulong local_120;
  ZSTD_fseCTables_t *local_118;
  seqDef *local_110;
  rawSeqStore_t ldmSeqStore;
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar6 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar6->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    uVar17 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar2 = (zc->blockState).matchState.nextToUpdate;
    if (UVar2 + 0x180 < uVar17) {
      uVar25 = (uVar17 - UVar2) - 0x180;
      if (0xbf < uVar25) {
        uVar25 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar17 - uVar25;
    }
    iVar18 = 1;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      iVar18 = (uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
    }
    ms = &(zc->blockState).matchState;
    local_190 = &zc->seqStore;
    pZVar7 = (zc->blockState).nextCBlock;
    lVar22 = 0;
    do {
      pZVar7->rep[lVar22] = pZVar6->rep[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_1a0 = dstCapacity;
    local_178 = (uint *)dst;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      sVar13 = ZSTD_ldm_blockCompress
                         (&zc->externSeqStore,ms,local_190,((zc->blockState).nextCBlock)->rep,src,
                          srcSize);
LAB_0010e0f0:
      memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar13)),sVar13);
      ppBVar1 = &(zc->seqStore).lit;
      *ppBVar1 = *ppBVar1 + sVar13;
      bVar24 = true;
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm == 0) {
        sVar13 = (**(code **)((long)ZSTD_selectBlockCompressor::blockCompressor[0] +
                             (long)(int)(zc->appliedParams).cParams.strategy * 8 +
                             (ulong)(uint)(iVar18 * 0x50)))
                           (ms,local_190,((zc->blockState).nextCBlock)->rep,src,srcSize);
        goto LAB_0010e0f0;
      }
      ldmSeqStore.size = 0;
      ldmSeqStore.pos = 0;
      ldmSeqStore.seq = zc->ldmSequences;
      ldmSeqStore.capacity = zc->maxNbLdmSequences;
      unaff_R12 = ZSTD_ldm_generateSequences
                            (&zc->ldmState,&ldmSeqStore,&(zc->appliedParams).ldmParams,src,srcSize);
      if (unaff_R12 < 0xffffffffffffff89) {
        sVar13 = ZSTD_ldm_blockCompress
                           (&ldmSeqStore,ms,local_190,((zc->blockState).nextCBlock)->rep,src,srcSize
                           );
        goto LAB_0010e0f0;
      }
      bVar24 = false;
    }
    if (!bVar24) {
      return unaff_R12;
    }
    pZVar6 = (zc->blockState).prevCBlock;
    local_198 = (zc->blockState).nextCBlock;
    local_1a9 = 0x39 < (zc->appliedParams).cParams.windowLog;
    ZVar3 = (zc->appliedParams).cParams.strategy;
    local_148 = (ulong)ZVar3;
    local_1a8 = (zc->seqStore).litStart;
    uVar26 = (long)(zc->seqStore).lit - (long)local_1a8;
    ZVar4 = (zc->appliedParams).literalCompressionMode;
    bVar24 = true;
    if (ZVar4 != ZSTD_lcm_huffman) {
      if (ZVar4 == ZSTD_lcm_uncompressed) {
        bVar24 = false;
      }
      else if (ZVar3 == ZSTD_fast) {
        bVar24 = (zc->appliedParams).cParams.targetLength == 0;
      }
    }
    local_110 = (zc->seqStore).sequencesStart;
    local_150 = (zc->seqStore).sequences;
    local_160 = zc->entropyWorkspace;
    local_138 = (ulong)(uint)zc->bmi2;
    local_130 = (zc->seqStore).ofCode;
    bVar16 = 6;
    if (ZSTD_btopt < ZVar3) {
      bVar16 = (char)ZVar3 - 1;
    }
    local_128 = (zc->seqStore).llCode;
    local_140 = (zc->seqStore).mlCode;
    local_180 = srcSize;
    memcpy(local_198,pZVar6,0x404);
    sVar13 = local_180;
    local_188 = pZVar6;
    if (bVar24) {
      uVar30 = 0x3f;
      if ((pZVar6->entropy).huf.repeatMode == HUF_repeat_valid) {
        uVar30 = 6;
      }
      if (uVar30 < uVar26) {
        uVar27 = ((ulong)(0x3ff < uVar26) - (ulong)(uVar26 < 0x4000)) + 4;
        uVar30 = 0xffffffffffffffba;
        sVar23 = local_1a0 - uVar27;
        if (uVar27 <= local_1a0 && sVar23 != 0) {
          HVar5 = (pZVar6->entropy).huf.repeatMode;
          ldmSeqStore.seq = (rawSeq *)CONCAT44(ldmSeqStore.seq._4_4_,HVar5);
          bVar24 = uVar26 < 0x401 && (uint)local_148 < 4;
          if (uVar27 == 3 && HVar5 == HUF_repeat_valid || uVar26 < 0x100) {
            uVar30 = HUF_compress1X_repeat
                               ((void *)((long)local_178 + uVar27),sVar23,local_1a8,uVar26,0xff,0xb,
                                local_160,0x1800,(HUF_CElt *)local_198,(HUF_repeat *)&ldmSeqStore,
                                (uint)bVar24,(int)local_138);
          }
          else {
            uVar30 = HUF_compress4X_repeat
                               ((void *)((long)local_178 + uVar27),sVar23,local_1a8,uVar26,0xff,0xb,
                                local_160,0x1800,(HUF_CElt *)local_198,(HUF_repeat *)&ldmSeqStore,
                                (uint)bVar24,(int)local_138);
          }
          puVar9 = local_178;
          uVar17 = 3 - ((int)ldmSeqStore.seq == 0);
          if (uVar30 < (uVar26 - (uVar26 >> (bVar16 & 0x3f))) - 2 && uVar30 - 1 < 0xffffffffffffff88
             ) {
            iVar18 = (int)uVar26;
            if (uVar30 == 1) {
              memcpy(local_198,local_188,0x404);
              lVar22 = ((ulong)(0x1f < uVar26) - (ulong)(uVar26 < 0x1000)) + 2;
              if (lVar22 == 3) {
                *puVar9 = iVar18 << 4 | 0xd;
              }
              else if ((int)lVar22 == 2) {
                *(ushort *)puVar9 = (ushort)(iVar18 << 4) | 5;
              }
              else {
                *(char *)puVar9 = (char)uVar26 * '\b' + '\x01';
              }
              *(BYTE *)((long)puVar9 + lVar22) = *local_1a8;
              uVar30 = (ulong)((int)lVar22 + 1);
            }
            else {
              if ((int)ldmSeqStore.seq == 0) {
                (local_198->entropy).huf.repeatMode = HUF_repeat_check;
              }
              iVar12 = (int)uVar30;
              if (uVar27 == 5) {
                *local_178 = iVar12 * 0x400000 + iVar18 * 0x10 | uVar17 | 0xc;
                *(char *)(local_178 + 1) = (char)(uVar30 >> 10);
              }
              else if (uVar27 == 4) {
                *local_178 = iVar12 * 0x40000 + iVar18 * 0x10 | uVar17 | 8;
              }
              else {
                iVar18 = iVar12 * 0x4000 +
                         ((uVar17 | iVar18 * 0x10 +
                                    (uint)(uVar27 == 3 && HVar5 == HUF_repeat_valid ||
                                          uVar26 < 0x100) * 4) ^ 4);
                *(short *)local_178 = (short)iVar18;
                *(char *)((long)local_178 + 2) = (char)((uint)iVar18 >> 0x10);
              }
              uVar30 = uVar30 + uVar27;
            }
          }
          else {
            memcpy(local_198,local_188,0x404);
            uVar30 = ZSTD_noCompressLiterals(local_178,local_1a0,local_1a8,uVar26);
          }
        }
      }
      else {
        uVar30 = ZSTD_noCompressLiterals(local_178,local_1a0,local_1a8,uVar26);
        sVar13 = local_180;
      }
    }
    else {
      uVar30 = ZSTD_noCompressLiterals(local_178,local_1a0,local_1a8,uVar26);
      sVar13 = local_180;
    }
    puVar9 = local_178;
    seqStorePtr = local_190;
    pZVar6 = local_198;
    sVar23 = local_1a0;
    psVar14 = (seqStore_t *)uVar30;
    if ((uVar30 < 0xffffffffffffff89) &&
       (psVar14 = (seqStore_t *)0xffffffffffffffba, 3 < (long)(local_1a0 - uVar30))) {
      uVar26 = (long)local_150 - (long)local_110 >> 3;
      pbVar28 = (byte *)(uVar30 + (long)local_178);
      if (uVar26 < 0x7f) {
        *pbVar28 = (byte)uVar26;
        pbVar28 = pbVar28 + 1;
      }
      else if (uVar26 < 0x7f00) {
        *pbVar28 = (byte)(uVar26 >> 8) | 0x80;
        pbVar28[1] = (byte)uVar26;
        pbVar28 = pbVar28 + 2;
      }
      else {
        *pbVar28 = 0xff;
        *(short *)(pbVar28 + 1) = (short)uVar26 + -0x7f00;
        pbVar28 = pbVar28 + 3;
      }
      local_118 = &(local_198->entropy).fse;
      if (local_150 == local_110) {
        memcpy(local_118,&(local_188->entropy).fse,0xde0);
        psVar14 = (seqStore_t *)((long)pbVar28 - (long)puVar9);
        sVar13 = local_180;
      }
      else {
        local_150 = (seqDef *)(local_198->entropy).fse.litlengthCTable;
        local_1a8 = (BYTE *)(local_1a0 + (long)local_178);
        pbVar31 = pbVar28 + 1;
        local_190 = (seqStore_t *)uVar30;
        ZSTD_seqToCodes(seqStorePtr);
        pUVar10 = local_160;
        max = 0x23;
        sVar23 = 0x10e54b;
        sVar13 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_128,uVar26,local_160,0x1800);
        (pZVar6->entropy).fse.litlength_repeatMode = (local_188->entropy).fse.litlength_repeatMode;
        pFVar20 = (local_188->entropy).fse.litlengthCTable;
        local_154 = ZSTD_selectEncodingType
                              (&(pZVar6->entropy).fse.litlength_repeatMode,(uint *)&ldmSeqStore,max,
                               sVar13,uVar26,9,pFVar20,LL_defaultNorm,6,ZSTD_defaultAllowed,
                               (ZSTD_strategy)local_148);
        local_168 = (FSE_CTable *)pbVar31;
        psVar14 = (seqStore_t *)
                  ZSTD_buildCTable(pbVar31,(long)local_1a8 - (long)pbVar31,&local_150->offset,9,
                                   local_154,(uint *)&ldmSeqStore,max,local_128,uVar26,
                                   LL_defaultNorm,6,0x23,pFVar20,0x524,pUVar10,sVar23);
        pUVar10 = local_160;
        pZVar6 = local_188;
        sVar13 = local_180;
        sVar23 = local_1a0;
        if (psVar14 < 0xffffffffffffff89) {
          pbVar31 = (byte *)((long)local_168 + (long)psVar14);
          local_170 = &(local_188->entropy).fse;
          max = 0x1f;
          sVar23 = 0x10e67a;
          sVar13 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_130,uVar26,local_160,0x1800);
          pZVar21 = local_170;
          (local_198->entropy).fse.offcode_repeatMode = (pZVar6->entropy).fse.offcode_repeatMode;
          sVar11 = ZSTD_selectEncodingType
                             (&(local_198->entropy).fse.offcode_repeatMode,(uint *)&ldmSeqStore,max,
                              sVar13,uVar26,8,local_170->offcodeCTable,OF_defaultNorm,5,
                              (uint)(max < 0x1d),(ZSTD_strategy)local_148);
          local_120 = (ulong)sVar11;
          psVar14 = (seqStore_t *)
                    ZSTD_buildCTable(pbVar31,(long)local_1a8 - (long)pbVar31,
                                     local_118->offcodeCTable,8,sVar11,(uint *)&ldmSeqStore,max,
                                     local_130,uVar26,OF_defaultNorm,5,0x1c,pZVar21->offcodeCTable,
                                     0x304,pUVar10,sVar23);
          pZVar6 = local_198;
          sVar13 = local_180;
          sVar23 = local_1a0;
          if (psVar14 < 0xffffffffffffff89) {
            local_170 = (ZSTD_fseCTables_t *)(pbVar31 + (long)psVar14);
            if (local_154 != set_compressed) {
              local_168 = (FSE_CTable *)(byte *)0x0;
            }
            pbVar29 = (byte *)local_168;
            if ((int)local_120 == 2) {
              pbVar29 = pbVar31;
            }
            local_168 = (local_198->entropy).fse.matchlengthCTable;
            max = 0x34;
            sVar23 = 0x10e7c0;
            sVar13 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_140,uVar26,pUVar10,0x1800);
            (pZVar6->entropy).fse.matchlength_repeatMode =
                 (local_188->entropy).fse.matchlength_repeatMode;
            pFVar20 = (local_188->entropy).fse.matchlengthCTable;
            sVar11 = ZSTD_selectEncodingType
                               (&(pZVar6->entropy).fse.matchlength_repeatMode,(uint *)&ldmSeqStore,
                                max,sVar13,uVar26,9,pFVar20,ML_defaultNorm,6,ZSTD_defaultAllowed,
                                (ZSTD_strategy)local_148);
            sVar15 = ZSTD_buildCTable(local_170,(long)local_1a8 - (long)local_170,local_168,9,sVar11
                                      ,(uint *)&ldmSeqStore,max,local_140,uVar26,ML_defaultNorm,6,
                                      0x34,pFVar20,0x5ac,local_160,sVar23);
            sVar19 = 0;
            psVar14 = (seqStore_t *)sVar15;
            pZVar21 = (ZSTD_fseCTables_t *)pbVar29;
            if (sVar15 < 0xffffffffffffff89) {
              sVar19 = sVar15;
              psVar14 = local_190;
              pZVar21 = local_170;
            }
            if (sVar11 != set_compressed) {
              pZVar21 = (ZSTD_fseCTables_t *)pbVar29;
            }
            sVar13 = local_180;
            sVar23 = local_1a0;
            if (sVar15 < 0xffffffffffffff89) {
              pbVar31 = (byte *)((long)local_170 + sVar19);
              *pbVar28 = (char)((int)local_120 << 4) + (char)(local_154 << 6) +
                         (char)sVar11 * '\x04';
              sVar13 = ZSTD_encodeSequences
                                 (pbVar31,(long)local_1a8 - (long)pbVar31,local_168,local_140,
                                  local_118->offcodeCTable,local_130,&local_150->offset,local_128,
                                  local_110,uVar26,(uint)local_1a9,(int)local_138);
              if (sVar13 < 0xffffffffffffff89) {
                pbVar31 = pbVar31 + sVar13;
                bVar8 = 3 < (long)pbVar31 - (long)pZVar21;
                bVar24 = bVar8 || pZVar21 == (ZSTD_fseCTables_t *)0x0;
                sVar13 = (size_t)psVar14;
                if (!bVar8 && pZVar21 != (ZSTD_fseCTables_t *)0x0) {
                  sVar13 = 0;
                }
              }
              else {
                bVar24 = false;
              }
              psVar14 = (seqStore_t *)sVar13;
              sVar13 = local_180;
              sVar23 = local_1a0;
              if (bVar24) {
                psVar14 = (seqStore_t *)((long)pbVar31 - (long)local_178);
              }
            }
          }
        }
      }
    }
    if ((psVar14 != (seqStore_t *)0x0) &&
       ((sVar23 < sVar13 || (psVar14 != (seqStore_t *)0xffffffffffffffba)))) {
      if (psVar14 < 0xffffffffffffff89) {
        ZVar3 = (zc->appliedParams).cParams.strategy;
        bVar16 = 6;
        if (ZSTD_btopt < ZVar3) {
          bVar16 = (char)ZVar3 - 1;
        }
        if ((sVar13 - (sVar13 >> (bVar16 & 0x3f))) - 2 <= psVar14) {
          psVar14 = (seqStore_t *)0;
        }
      }
      goto LAB_0010decf;
    }
  }
  psVar14 = (seqStore_t *)0;
LAB_0010decf:
  if ((long)psVar14 - 1U < 0xffffffffffffff88) {
    pZVar6 = (zc->blockState).prevCBlock;
    (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
    (zc->blockState).nextCBlock = pZVar6;
  }
  pZVar6 = (zc->blockState).prevCBlock;
  if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return (size_t)psVar14;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}